

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lls.c
# Opt level: O0

int lls_normal(double *A,double *b,int M,int N,double *x)

{
  int iVar1;
  double *col;
  double *C_00;
  double *C_01;
  double *__ptr;
  double *col_00;
  double *CT;
  double *y;
  double *C;
  double *d;
  double *AT;
  double sum;
  int l;
  int c1;
  int j;
  int i;
  int sc;
  int retcode;
  double *x_local;
  int N_local;
  int M_local;
  double *b_local;
  double *A_local;
  
  col = (double *)malloc((long)M * 8 * (long)N);
  C_00 = (double *)malloc((long)N << 3);
  C_01 = (double *)malloc((long)N * 8 * (long)N);
  __ptr = (double *)malloc((long)N << 3);
  col_00 = (double *)malloc((long)N * 8 * (long)N);
  mtranspose(A,M,N,col);
  mmult(col,b,C_00,N,M,1);
  mmult(col,A,C_01,N,M,N);
  iVar1 = chol(C_01,N);
  if (iVar1 == -1) {
    A_local._4_4_ = -1;
  }
  else {
    mtranspose(C_01,N,N,col_00);
    *__ptr = *C_00 / *col_00;
    for (c1 = 1; c1 < N; c1 = c1 + 1) {
      AT = (double *)0x0;
      for (l = 0; l < c1; l = l + 1) {
        AT = (double *)(__ptr[l] * col_00[c1 * N + l] + (double)AT);
      }
      __ptr[c1] = (C_00[c1] - (double)AT) / col_00[c1 * N + c1];
    }
    x[N + -1] = __ptr[N + -1] / C_01[N * N + -1];
    for (c1 = N + -2; -1 < c1; c1 = c1 + -1) {
      AT = (double *)0x0;
      iVar1 = c1 * (N + 1);
      sum._0_4_ = 0;
      l = c1;
      while (l = l + 1, l < N) {
        sum._0_4_ = sum._0_4_ + 1;
        AT = (double *)(C_01[iVar1 + sum._0_4_] * x[l] + (double)AT);
      }
      x[c1] = (__ptr[c1] - (double)AT) / C_01[iVar1];
    }
    free(col);
    free(C_00);
    free(C_01);
    free(__ptr);
    A_local._4_4_ = 0;
  }
  return A_local._4_4_;
}

Assistant:

int lls_normal(double *A,double *b,int M,int N,double *x) {
	int retcode,sc,i,j,c1,l;
	double sum;
	double *AT,*d,*C,*y,*CT;
	// M - data points
	// N - Number of parameters
	// A - MXN; b size - M vector; AT - NXM

	AT = (double*) malloc(sizeof(double) * M * N);
	d = (double*) malloc(sizeof(double) * N);
	C = (double*) malloc(sizeof(double) * N * N);
	y = (double*) malloc(sizeof(double) * N);
	CT = (double*) malloc(sizeof(double) * N * N);

	retcode = 0;

	mtranspose(A,M,N,AT);
	mmult(AT,b,d,N,M,1);
	mmult(AT,A,C,N,M,N);

	sc = chol(C,N);
	if (sc == -1) {
		return -1;
	}

	mtranspose(C,N,N,CT);
	//Forward Substitution

	y[0] = d[0]/CT[0];
	for(i = 1; i < N; ++i) {
		sum = 0.;
		c1 = i*N;
		for(j = 0; j < i; ++j) {
			sum += y[j] * CT[c1 + j];
		}
		y[i] = (d[i] - sum)/CT[c1+i];
	}

	//Back Substitution

	x[N - 1] = y[N - 1]/C[N * N - 1];

	for (i = N - 2; i >= 0; i--) {
		sum = 0.;
		c1 = i*(N+1);
		l=0;
		for(j = i+1; j < N;j++) {
			l++;
			sum += C[c1 + l] * x[j];
		}
		x[i] = (y[i] - sum) / C[c1];
	}

	free(AT);
	free(d);
	free(C);
	free(y);
	return retcode;
}